

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::time::writer<std::wostream>
          (time *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os)

{
  size_t sVar1;
  wostream *pwVar2;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar3;
  char *pcVar4;
  char time_str [100];
  tm tm;
  
  pcVar4 = time_str;
  gm_time(&tm,(long)this->ms_ / 1000);
  sVar1 = strftime(time_str,100,"%FT%TZ",(tm *)&tm);
  if (sVar1 == 0) {
    pwVar2 = std::operator<<(os,"Time(");
    pbVar3 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
    pcVar4 = "ms)";
  }
  else {
    time_str[99] = '\0';
    pbVar3 = os;
  }
  std::operator<<(pbVar3,pcVar4);
  return os;
}

Assistant:

OStream & time::writer (OStream & os) const {
            bool fallback = true;
            std::tm const tm = gm_time (this->milliseconds_to_time ());
            char time_str[100];
            // strftime() returns 0 if the result doesn't fit in the provided buffer;
            // the contents are undefined. 100 characters should be plenty for an ISO8601 date.
            if (std::strftime (time_str, sizeof (time_str), "%FT%TZ", &tm) != 0) {
                // Guarantee that the string is null terminated.
                time_str[array_elements (time_str) - 1] = '\0';
                os << time_str;
                fallback = false;
            }

            if (fallback) {
                os << "Time(" << ms_ << "ms)";
            }
            return os;
        }